

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-op.c
# Opt level: O0

void tcg_gen_eqv_i64_ppc64(TCGContext_conflict10 *tcg_ctx,TCGv_i64 ret,TCGv_i64 arg1,TCGv_i64 arg2)

{
  TCGv_i64 arg2_local;
  TCGv_i64 arg1_local;
  TCGv_i64 ret_local;
  TCGContext_conflict10 *tcg_ctx_local;
  
  tcg_gen_xor_i64_ppc64(tcg_ctx,ret,arg1,arg2);
  tcg_gen_not_i64_ppc64(tcg_ctx,ret,ret);
  return;
}

Assistant:

void tcg_gen_eqv_i64(TCGContext *tcg_ctx, TCGv_i64 ret, TCGv_i64 arg1, TCGv_i64 arg2)
{
#if TCG_TARGET_REG_BITS == 32
        tcg_gen_eqv_i32(tcg_ctx, TCGV_LOW(tcg_ctx, ret), TCGV_LOW(tcg_ctx, arg1), TCGV_LOW(tcg_ctx, arg2));
        tcg_gen_eqv_i32(tcg_ctx, TCGV_HIGH(tcg_ctx, ret), TCGV_HIGH(tcg_ctx, arg1), TCGV_HIGH(tcg_ctx, arg2));
#elif TCG_TARGET_HAS_eqv_i64
        tcg_gen_op3_i64(tcg_ctx, INDEX_op_eqv_i64, ret, arg1, arg2);
#else
        tcg_gen_xor_i64(tcg_ctx, ret, arg1, arg2);
        tcg_gen_not_i64(tcg_ctx, ret, ret);
#endif
}